

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixMapfile(unixFile *pFd,i64 nMap)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  i64 nReuse;
  char *zFunc;
  long lVar8;
  long in_FS_OFFSET;
  stat statbuf;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pFd->nFetchOut < 1) {
    if (nMap < 0) {
      memset(&statbuf,0xaa,0x90);
      iVar6 = (*aSyscall[5].pCurrent)((ulong)(uint)pFd->h,&statbuf);
      iVar5 = 0x70a;
      nMap = statbuf.st_size;
      if (iVar6 != 0) goto LAB_00130343;
    }
    lVar3 = pFd->mmapSize;
    lVar8 = pFd->mmapSizeMax;
    if (nMap < pFd->mmapSizeMax) {
      lVar8 = nMap;
    }
    if (lVar8 != lVar3) {
      uVar1 = pFd->h;
      pvVar4 = pFd->pMapRegion;
      if (pvVar4 == (void *)0x0) {
        zFunc = "mmap";
LAB_00130426:
        pvVar7 = (void *)(*aSyscall[0x16].pCurrent)(0,lVar8,1,1,(ulong)uVar1,0);
      }
      else {
        if (pFd->mmapSizeActual != lVar3) {
          (*aSyscall[0x17].pCurrent)(lVar3 + (long)pvVar4);
        }
        pvVar7 = (void *)(*aSyscall[0x18].pCurrent)(pvVar4,lVar3,lVar8,1);
        if ((long)pvVar7 + 1U < 2) {
          (*aSyscall[0x17].pCurrent)(pvVar4,lVar3);
          zFunc = "mremap";
          if (pvVar7 == (void *)0x0) goto LAB_00130426;
        }
        else {
          zFunc = "mremap";
        }
      }
      if (pvVar7 == (void *)0xffffffffffffffff) {
        pvVar7 = (void *)0x0;
        unixLogErrorAtLine(0,zFunc,pFd->zPath,0xabb1);
        pFd->mmapSizeMax = 0;
        lVar8 = 0;
      }
      pFd->pMapRegion = pvVar7;
      pFd->mmapSizeActual = lVar8;
      pFd->mmapSize = lVar8;
    }
  }
  iVar5 = 0;
LAB_00130343:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nMap){
  assert( nMap>=0 || pFd->nFetchOut==0 );
  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    if( osFstat(pFd->h, &statbuf) ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( nMap!=pFd->mmapSize ){
    unixRemapfile(pFd, nMap);
  }

  return SQLITE_OK;
}